

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argparse::Argument::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Argument *this)

{
  logic_error *this_00;
  pointer __any;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __any = (this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__any == (this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    if ((this->m_default_value)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_58,"No value provided for \'",
                     (this->m_names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::operator+(&local_38,&bStack_58,"\'.");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    __any = &this->m_default_value;
  }
  std::any_cast<std::__cxx11::string>(__return_storage_ptr__,__any);
  return __return_storage_ptr__;
}

Assistant:

T get() const {
    if (!m_values.empty()) {
      if constexpr (details::IsContainer<T>) {
        return any_cast_container<T>(m_values);
      } else {
        return std::any_cast<T>(m_values.front());
      }
    }
    if (m_default_value.has_value()) {
      return std::any_cast<T>(m_default_value);
    }
    if constexpr (details::IsContainer<T>) {
      if (!m_accepts_optional_like_value) {
        return any_cast_container<T>(m_values);
      }
    }

    throw std::logic_error("No value provided for '" + m_names.back() + "'.");
  }